

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O3

ExprBase * EvaluateArraySetup(ExpressionEvalContext *ctx,ExprArraySetup *expression)

{
  TypeBase *pTVar1;
  _func_int **pp_Var2;
  Allocator *pAVar3;
  SynBase *pSVar4;
  long lVar5;
  bool bVar6;
  int iVar7;
  ExprBase *pEVar8;
  ExprBase *pEVar9;
  undefined4 extraout_var;
  TypeRef *pTVar10;
  undefined4 extraout_var_00;
  _func_int **pp_Var11;
  ulong uVar12;
  ExprBase *target;
  
  if (ctx->instruction < ctx->instructionsLimit) {
    ctx->instruction = ctx->instruction + 1;
    pTVar1 = expression->lhs->type;
    if ((pTVar1 == (TypeBase *)0x0) || (pTVar1->typeID != 0x12)) {
      __assert_fail("refType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0x70f,"ExprBase *EvaluateArraySetup(ExpressionEvalContext &, ExprArraySetup *)"
                   );
    }
    pp_Var2 = pTVar1[1]._vptr_TypeBase;
    if ((pp_Var2 == (_func_int **)0x0) || (*(int *)(pp_Var2 + 1) != 0x13)) {
      __assert_fail("arrayType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0x713,"ExprBase *EvaluateArraySetup(ExpressionEvalContext &, ExprArraySetup *)"
                   );
    }
    pEVar8 = Evaluate(ctx,expression->initializer);
    if (((pEVar8 != (ExprBase *)0x0) &&
        (pEVar9 = Evaluate(ctx,expression->lhs), pEVar9 != (ExprBase *)0x0)) &&
       (pEVar9->typeID == 0xc)) {
      if (*(int *)(pp_Var2 + 0xd) != 0) {
        uVar12 = 0;
        do {
          if (ctx->instructionsLimit <= ctx->instruction) goto LAB_001394c3;
          ctx->instruction = ctx->instruction + 1;
          pp_Var11 = (_func_int **)
                     (*(long *)(pp_Var2[0xc] + 0x30) * uVar12 + (long)pEVar9[1]._vptr_ExprBase);
          if (*(ulong *)&pEVar9[1].typeID < (ulong)(*(long *)(pp_Var2[0xc] + 0x30) + (long)pp_Var11)
             ) {
            __assert_fail("ptr->ptr + i * arrayType->subType->size + arrayType->subType->size <= ptr->end"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                          ,0x725,
                          "ExprBase *EvaluateArraySetup(ExpressionEvalContext &, ExprArraySetup *)")
            ;
          }
          pAVar3 = ctx->ctx->allocator;
          iVar7 = (*pAVar3->_vptr_Allocator[2])(pAVar3,0x40);
          target = (ExprBase *)CONCAT44(extraout_var,iVar7);
          pSVar4 = (expression->super_ExprBase).source;
          pTVar10 = ExpressionContext::GetReferenceType(ctx->ctx,(TypeBase *)pp_Var2[0xc]);
          lVar5 = *(long *)(pp_Var2[0xc] + 0x30);
          target->typeID = 0xc;
          target->source = pSVar4;
          target->type = &pTVar10->super_TypeBase;
          target->next = (ExprBase *)0x0;
          target->listed = false;
          target->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223458;
          target[1]._vptr_ExprBase = pp_Var11;
          *(long *)&target[1].typeID = (long)pp_Var11 + lVar5;
          if (lVar5 < 0) {
            __assert_fail("ptr <= end",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.h"
                          ,0x279,
                          "ExprPointerLiteral::ExprPointerLiteral(SynBase *, TypeBase *, unsigned char *, unsigned char *)"
                         );
          }
          bVar6 = CreateStore(ctx,target,pEVar8);
          if (!bVar6) {
            return (ExprBase *)0x0;
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 < *(uint *)(pp_Var2 + 0xd));
      }
      pAVar3 = ctx->ctx->allocator;
      iVar7 = (*pAVar3->_vptr_Allocator[2])(pAVar3,0x30);
      pEVar8 = (ExprBase *)CONCAT44(extraout_var_00,iVar7);
      pSVar4 = (expression->super_ExprBase).source;
      pTVar1 = ctx->ctx->typeVoid;
      pEVar8->typeID = 2;
      pEVar8->source = pSVar4;
      pEVar8->type = pTVar1;
      pEVar8->next = (ExprBase *)0x0;
      pEVar8->listed = false;
      pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223698;
      pEVar8 = CheckType(&expression->super_ExprBase,pEVar8);
      return pEVar8;
    }
  }
  else {
LAB_001394c3:
    Report(ctx,"ERROR: instruction limit reached");
  }
  return (ExprBase *)0x0;
}

Assistant:

ExprBase* EvaluateArraySetup(ExpressionEvalContext &ctx, ExprArraySetup *expression)
{
	if(!AddInstruction(ctx))
		return NULL;

	TypeRef *refType = getType<TypeRef>(expression->lhs->type);

	assert(refType);

	TypeArray *arrayType = getType<TypeArray>(refType->subType);

	assert(arrayType);

	ExprBase *initializer = Evaluate(ctx, expression->initializer);

	if(!initializer)
		return NULL;

	ExprPointerLiteral *ptr = getType<ExprPointerLiteral>(Evaluate(ctx, expression->lhs));

	if(!ptr)
		return NULL;

	for(unsigned i = 0; i < unsigned(arrayType->length); i++)
	{
		if(!AddInstruction(ctx))
			return NULL;

		assert(ptr);
		assert(ptr->ptr + i * arrayType->subType->size + arrayType->subType->size <= ptr->end);

		unsigned char *targetPtr = ptr->ptr + i * arrayType->subType->size;

		ExprPointerLiteral *shifted = new (ctx.ctx.get<ExprPointerLiteral>()) ExprPointerLiteral(expression->source, ctx.ctx.GetReferenceType(arrayType->subType), targetPtr, targetPtr + arrayType->subType->size);

		if(!CreateStore(ctx, shifted, initializer))
			return NULL;
	}

	return CheckType(expression, new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid));
}